

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom3d.c
# Opt level: O1

matrix4 * v3matMul(matrix4 *a,matrix4 *b,matrix4 *c)

{
  double *pdVar1;
  int i;
  long lVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  
  lVar2 = 0;
  do {
    lVar4 = 0;
    pdVar3 = (double *)b;
    do {
      pdVar1 = c->element[lVar2] + lVar4;
      *pdVar1 = 0.0;
      dVar6 = 0.0;
      lVar5 = 0;
      do {
        dVar6 = dVar6 + *(double *)((long)*(double (*) [4])*(double (*) [4])a + lVar5) *
                        *(double *)((long)pdVar3 + lVar5 * 4);
        *pdVar1 = dVar6;
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x20);
      lVar4 = lVar4 + 1;
      pdVar3 = pdVar3 + 1;
    } while (lVar4 != 4);
    lVar2 = lVar2 + 1;
    a = (matrix4 *)((long)a + 0x20);
  } while (lVar2 != 4);
  return c;
}

Assistant:

matrix4*    v3matMul(matrix4* a, matrix4* b, matrix4* c) {
	int i, j, k;
	for (i=0; i < 4; i++) {
		for (j=0; j < 4; j++) {
			c->element[i][j] = 0.0;
			for (k=0; k < 4; k++) {
				c->element[i][j] +=
					a->element[i][k] * b->element[k][j];
			}
		}
	}
	return(c);
}